

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void ft_remove_renderer(FT_Module module)

{
  FT_Library library_00;
  FT_Memory memory_00;
  FT_ListNode node_00;
  FT_Renderer_conflict render;
  FT_ListNode node;
  FT_Memory memory;
  FT_Library library;
  FT_Module module_local;
  
  library_00 = module->library;
  if (library_00 != (FT_Library)0x0) {
    memory_00 = library_00->memory;
    node_00 = FT_List_Find(&library_00->renderers,module);
    if (node_00 != (FT_ListNode)0x0) {
      if (((int)module[1].clazz[1].module_flags == 0x6f75746c) &&
         (module[4].library != (FT_Library)0x0)) {
        (**(code **)((long)module[1].clazz[1].module_interface + 0x28))(module[4].library);
      }
      FT_List_Remove(&library_00->renderers,node_00);
      ft_mem_free(memory_00,node_00);
      ft_set_current_renderer(library_00);
    }
  }
  return;
}

Assistant:

static void
  ft_remove_renderer( FT_Module  module )
  {
    FT_Library   library;
    FT_Memory    memory;
    FT_ListNode  node;


    library = module->library;
    if ( !library )
      return;

    memory = library->memory;

    node = FT_List_Find( &library->renderers, module );
    if ( node )
    {
      FT_Renderer  render = FT_RENDERER( module );


      /* release raster object, if any */
      if ( render->clazz->glyph_format == FT_GLYPH_FORMAT_OUTLINE &&
           render->raster                                         )
        render->clazz->raster_class->raster_done( render->raster );

      /* remove from list */
      FT_List_Remove( &library->renderers, node );
      FT_FREE( node );

      ft_set_current_renderer( library );
    }
  }